

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O0

bool __thiscall
Js::
MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
::Iterator::Next(Iterator *this)

{
  code *pcVar1;
  MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  **ppMVar2;
  MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar3;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  **ppMVar4;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar5;
  undefined4 *puVar6;
  bool bVar7;
  nullptr_t local_50;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  Iterator *local_18;
  Iterator *this_local;
  
  local_18 = this;
  ppMVar2 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataList__((WriteBarrierPtr *)this);
  if (*ppMVar2 !=
      (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
       *)0x0) {
    pMVar3 = Memory::
             WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
             ::operator->(&this->list);
    ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                        ((WriteBarrierPtr *)pMVar3);
    if (*ppMVar4 !=
        (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
         *)0x0) {
      ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                          ((WriteBarrierPtr *)&this->current);
      if (*ppMVar4 !=
          (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
           *)0x0) {
        while( true ) {
          pMVar5 = Memory::
                   WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                   ::operator->(&this->current);
          ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                              ((WriteBarrierPtr *)&pMVar5->prev);
          bVar7 = false;
          if (*ppMVar4 !=
              (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
               *)0x0) {
            pMVar5 = Memory::
                     WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                     ::operator->(&this->current);
            pMVar5 = Memory::
                     WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                     ::operator->(&pMVar5->prev);
            ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                                ((WriteBarrierPtr *)pMVar5);
            pMVar5 = *ppMVar4;
            ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                                ((WriteBarrierPtr *)&this->current);
            bVar7 = pMVar5 != *ppMVar4;
          }
          if (!bVar7) break;
          pMVar5 = Memory::
                   WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                   ::operator->(&this->current);
          Memory::
          WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
          ::operator=(&this->current,&pMVar5->prev);
        }
        pMVar5 = Memory::
                 WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                 ::operator->(&this->current);
        ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                            ((WriteBarrierPtr *)&pMVar5->prev);
        if (*ppMVar4 ==
            (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
             *)0x0) {
          ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                              ((WriteBarrierPtr *)&this->current);
          pMVar5 = *ppMVar4;
          pMVar3 = Memory::
                   WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                   ::operator->(&this->list);
          ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                              ((WriteBarrierPtr *)pMVar3);
          if (pMVar5 != *ppMVar4) {
            pMVar3 = Memory::
                     WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                     ::operator->(&this->list);
            Memory::
            WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
            ::operator=(&this->current,&pMVar3->first);
            ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                                ((WriteBarrierPtr *)&this->current);
            if (*ppMVar4 !=
                (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                 *)0x0) {
              return true;
            }
            local_30 = (nullptr_t)0x0;
            Memory::
            WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
            ::operator=(&this->list,&local_30);
            local_38 = (nullptr_t)0x0;
            Memory::
            WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
            ::operator=(&this->current,&local_38);
            return false;
          }
        }
        pMVar5 = Memory::
                 WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                 ::operator->(&this->current);
        ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                            ((WriteBarrierPtr *)pMVar5);
        if (*ppMVar4 ==
            (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
             *)0x0) {
          ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                              ((WriteBarrierPtr *)&this->current);
          pMVar5 = *ppMVar4;
          pMVar3 = Memory::
                   WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                   ::operator->(&this->list);
          ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                              ((WriteBarrierPtr *)&pMVar3->last);
          if (pMVar5 != *ppMVar4) {
            pMVar3 = Memory::
                     WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                     ::operator->(&this->list);
            ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                                ((WriteBarrierPtr *)&pMVar3->last);
            if (*ppMVar4 !=
                (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                          ,100,"(list->last == nullptr)","list->last == nullptr");
              if (!bVar7) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            local_40 = (nullptr_t)0x0;
            Memory::
            WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
            ::operator=(&this->current,&local_40);
          }
        }
      }
      ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                          ((WriteBarrierPtr *)&this->current);
      pMVar5 = *ppMVar4;
      pMVar3 = Memory::
               WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
               ::operator->(&this->list);
      ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                          ((WriteBarrierPtr *)&pMVar3->last);
      if (pMVar5 != *ppMVar4) {
        ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                            ((WriteBarrierPtr *)&this->current);
        if (*ppMVar4 ==
            (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
             *)0x0) {
          pMVar3 = Memory::
                   WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                   ::operator->(&this->list);
          ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                              ((WriteBarrierPtr *)pMVar3);
          if (*ppMVar4 ==
              (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                        ,0x6d,"(list->first != nullptr)","list->first != nullptr");
            if (!bVar7) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          pMVar3 = Memory::
                   WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                   ::operator->(&this->list);
          Memory::
          WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
          ::operator=(&this->current,&pMVar3->first);
        }
        else {
          pMVar5 = Memory::
                   WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
                   ::operator->(&this->current);
          Memory::
          WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
          ::operator=(&this->current,&pMVar5->next);
        }
        return true;
      }
      local_48 = (nullptr_t)0x0;
      Memory::
      WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
      ::operator=(&this->list,&local_48);
      local_50 = (nullptr_t)0x0;
      Memory::
      WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
      ::operator=(&this->current,&local_50);
      return false;
    }
  }
  local_20 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<Js::MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
  ::operator=(&this->list,&local_20);
  local_28 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_>
  ::operator=(&this->current,&local_28);
  return false;
}

Assistant:

bool Next()
            {
                // Nodes can be deleted while iterating so validate current
                // and if it is not valid find last valid node by following
                // previous toward first.
                // Note: clear will simply null out first and last, but
                // not invalidated nodes, so we must also check to see that
                // first is not null

                if (list == nullptr || list->first == nullptr)
                {
                    // list is empty or was cleared during enumeration
                    list = nullptr;
                    current = nullptr;
                    return false;
                }

                if (current)
                {
                    while (current->prev && current->prev->next != current)
                    {
                        current = current->prev;
                    }

                    if (current->prev == nullptr && current != list->first)
                    {
                        current = list->first;

                        if (current != nullptr)
                        {
                            return true;
                        }

                        list = nullptr;
                        current = nullptr;
                        return false;
                    }

                    if (current->next == nullptr && current != list->last)
                    {
                        Assert(list->last == nullptr);
                        current = nullptr;
                    }
                }

                if (current != list->last)
                {
                    if (current == nullptr)
                    {
                        Assert(list->first != nullptr);
                        current = list->first;
                    }
                    else
                    {
                        current = current->next;
                    }
                    return true;
                }

                list = nullptr;
                current = nullptr;
                return false;
            }